

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::GetSongInfo(DROPlayer *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  size_type sVar2;
  PLR_SONG_INFO *songInf_local;
  DROPlayer *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    songInf->format = 0x44524f00;
    songInf->fileVerMaj = (this->_fileHdr).verMajor;
    songInf->fileVerMin = (this->_fileHdr).verMinor;
    songInf->tickRateMul = 1;
    songInf->tickRateDiv = this->_tickFreq;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    songInf->loopTick = 0xffffffff;
    songInf->volGain = 0x10000;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
    songInf->deviceCnt = (UINT32)sVar2;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 DROPlayer::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	songInf.format = FCC_DRO;
	songInf.fileVerMaj = _fileHdr.verMajor;
	songInf.fileVerMin = _fileHdr.verMinor;
	songInf.tickRateMul = 1;
	songInf.tickRateDiv = _tickFreq;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = (UINT32)-1;
	songInf.volGain = 0x10000;
	songInf.deviceCnt = (UINT32)_devTypes.size();
	
	return 0x00;
}